

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::DragBehaviorT<double,double,double>
               (ImGuiDataType data_type,double *v,float v_speed,double v_min,double v_max,
               char *format,ImGuiSliderFlags flags)

{
  double dVar1;
  ImGuiInputSource IVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  int iVar5;
  float *pfVar6;
  uint uVar7;
  ulong idx;
  undefined4 uVar8;
  float fVar9;
  undefined4 uVar10;
  float fVar11;
  float fVar12;
  double dVar13;
  float local_84;
  ImVec2 local_38;
  
  pIVar3 = GImGui;
  if ((((v_speed == 0.0) && (!NAN(v_speed))) && (v_min < v_max)) &&
     (v_max - v_min < 3.4028234663852886e+38)) {
    v_speed = (float)((v_max - v_min) * (double)GImGui->DragSpeedDefaultRatio);
  }
  uVar7 = data_type & 0xfffffffe;
  IVar2 = GImGui->ActiveIdSource;
  idx = (ulong)((flags & 0x100000U) >> 0x14);
  if (IVar2 == ImGuiInputSource_Mouse) {
    bVar4 = IsMousePosValid((ImVec2 *)0x0);
    if ((!bVar4) ||
       (bVar4 = IsMouseDragPastThreshold(0,(pIVar3->IO).MouseDragThreshold * 0.5), !bVar4)) {
      IVar2 = pIVar3->ActiveIdSource;
      goto LAB_00149fec;
    }
    pfVar6 = ImVec2::operator[](&(pIVar3->IO).MouseDelta,idx);
    fVar12 = *pfVar6;
    if ((pIVar3->IO).KeyAlt != false) {
      fVar12 = fVar12 * 0.01;
    }
    if ((pIVar3->IO).KeyShift == true) {
      fVar12 = fVar12 * 10.0;
    }
  }
  else {
LAB_00149fec:
    fVar12 = 0.0;
    if (IVar2 == ImGuiInputSource_Nav) {
      iVar5 = 0;
      if (uVar7 == 8) {
        iVar5 = ImParseFormatPrecision(format,3);
      }
      local_38 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.1,10.0);
      pfVar6 = ImVec2::operator[](&local_38,idx);
      fVar12 = *pfVar6;
      fVar11 = GetMinimumStepAtDecimalPrecision(iVar5);
      v_speed = (float)((uint)v_speed & -(uint)(fVar11 <= v_speed) |
                       ~-(uint)(fVar11 <= v_speed) & (uint)fVar11);
    }
  }
  fVar12 = fVar12 * v_speed;
  if ((flags & 0x100000U) != 0) {
    fVar12 = -fVar12;
  }
  if ((((flags & 0x20U) != 0) && (dVar13 = v_max - v_min, dVar13 < 3.4028234663852886e+38)) &&
     (9.999999974752427e-07 < dVar13)) {
    fVar12 = fVar12 / (float)dVar13;
  }
  if (v_min < v_max) {
    if ((v_max <= *v) && (0.0 < fVar12)) goto LAB_0014a130;
    bVar4 = fVar12 < 0.0 && *v <= v_min;
  }
  else {
    bVar4 = false;
  }
  if ((pIVar3->ActiveIdIsJustActivated == false) && (!bVar4)) {
    if ((fVar12 != 0.0) || (NAN(fVar12))) {
      pIVar3->DragCurrentAccum = pIVar3->DragCurrentAccum + fVar12;
      pIVar3->DragCurrentAccumDirty = true;
    }
    else if ((pIVar3->DragCurrentAccumDirty & 1U) == 0) {
      return false;
    }
    dVar13 = *v;
    if ((flags & 0x20U) == 0) {
      dVar13 = dVar13 + (double)pIVar3->DragCurrentAccum;
      local_84 = 0.0;
      fVar11 = 0.0;
    }
    else {
      if (uVar7 == 8) {
        iVar5 = ImParseFormatPrecision(format,3);
        fVar11 = (float)iVar5;
      }
      else {
        fVar11 = 1.0;
      }
      local_84 = powf(0.1,fVar11);
      fVar11 = ScaleRatioFromValueT<double,double,double>
                         (data_type,dVar13,v_min,v_max,true,local_84,0.0);
      dVar13 = ScaleValueFromRatioT<double,double,double>
                         (data_type,pIVar3->DragCurrentAccum + fVar11,v_min,v_max,true,local_84,0.0)
      ;
    }
    if ((flags & 0x40U) == 0) {
      dVar13 = RoundScalarWithFormatT<double,double>(format,data_type,dVar13);
    }
    pIVar3->DragCurrentAccumDirty = false;
    if ((flags & 0x20U) == 0) {
      dVar1 = *v;
      uVar8 = SUB84(dVar1,0);
      uVar10 = (undefined4)((ulong)dVar1 >> 0x20);
      pIVar3->DragCurrentAccum = pIVar3->DragCurrentAccum - (float)(dVar13 - dVar1);
    }
    else {
      fVar9 = ScaleRatioFromValueT<double,double,double>
                        (data_type,dVar13,v_min,v_max,true,local_84,0.0);
      pIVar3->DragCurrentAccum = pIVar3->DragCurrentAccum - (fVar9 - fVar11);
      uVar8 = SUB84(*v,0);
      uVar10 = (undefined4)((ulong)*v >> 0x20);
    }
    dVar13 = (double)(~-(ulong)(dVar13 == 0.0) & (ulong)dVar13);
    if (v_min < v_max) {
      if (((double)CONCAT44(uVar10,uVar8) != dVar13) ||
         (NAN((double)CONCAT44(uVar10,uVar8)) || NAN(dVar13))) {
        if ((dVar13 < v_min) ||
           (((uVar7 != 8 &&
             ((double)CONCAT44(uVar10,uVar8) <= dVar13 && dVar13 != (double)CONCAT44(uVar10,uVar8)))
            && (fVar12 < 0.0)))) {
          dVar13 = v_min;
        }
        if ((v_max < dVar13) ||
           (((uVar7 != 8 &&
             (dVar13 <= (double)CONCAT44(uVar10,uVar8) && (double)CONCAT44(uVar10,uVar8) != dVar13))
            && (0.0 < fVar12)))) {
          dVar13 = v_max;
        }
      }
    }
    if (((double)CONCAT44(uVar10,uVar8) == dVar13) &&
       (!NAN((double)CONCAT44(uVar10,uVar8)) && !NAN(dVar13))) {
      return false;
    }
    *v = dVar13;
    return true;
  }
LAB_0014a130:
  pIVar3->DragCurrentAccum = 0.0;
  pIVar3->DragCurrentAccumDirty = false;
  return false;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_clamped = (v_min < v_max);
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) != 0;
    const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);

    // Default tweak speed
    if (v_speed == 0.0f && is_clamped && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && IsMouseDragPastThreshold(0, g.IO.MouseDragThreshold * DRAG_MOUSE_THRESHOLD_FACTOR))
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 0;
        adjust_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 1.0f / 10.0f, 10.0f)[axis];
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // For logarithmic use our range is effectively 0..1 so scale the delta into that range
    if (is_logarithmic && (v_max - v_min < FLT_MAX) && ((v_max - v_min) > 0.000001f)) // Epsilon to avoid /0
        adjust_delta /= (float)(v_max - v_min);

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = is_clamped && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    if (is_just_activated || is_already_past_limits_and_pushing_outward)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    const float zero_deadzone_halfsize = 0.0f; // Drag widgets have no deadzone (as it doesn't make sense)
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);

        // Convert to parametric space, apply delta, convert back
        float v_old_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        float v_new_parametric = v_old_parametric + g.DragCurrentAccum;
        v_cur = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new_parametric, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        v_old_ref_for_accum_remainder = v_old_parametric;
    }
    else
    {
        v_cur += (SIGNEDTYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
        v_cur = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_logarithmic)
    {
        // Convert to parametric space, apply delta, convert back
        float v_new_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        g.DragCurrentAccum -= (float)(v_new_parametric - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && is_clamped)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_floating_point))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_floating_point))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}